

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCEtriangleShape.cpp
# Opt level: O3

void __thiscall
cbtCEtriangleShape::cbtCEtriangleShape
          (cbtCEtriangleShape *this,ChVector<double> *mp1,ChVector<double> *mp2,
          ChVector<double> *mp3,ChVector<double> *me1,ChVector<double> *me2,ChVector<double> *me3,
          bool mowns_vertex_1,bool mowns_vertex_2,bool mowns_vertex_3,bool mowns_edge_1,
          bool mowns_edge_2,bool mowns_edge_3,double msphereswept_rad)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  
  cbtConvexInternalShape::cbtConvexInternalShape(&this->super_cbtConvexInternalShape);
  (this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_00b49288;
  this->p1 = mp1;
  this->p2 = mp2;
  this->p3 = mp3;
  this->e1 = me1;
  this->e2 = me2;
  this->e3 = me3;
  auVar2 = vpbroadcastb_avx512vl(ZEXT116(1));
  uVar1 = (ushort)(byte)(mowns_vertex_1 * auVar2[0]);
  this->owns_vertex_1 = (bool)(char)uVar1;
  this->owns_vertex_2 = (bool)(char)(uVar1 >> 8);
  this->owns_vertex_3 = (bool)(-(char)((short)((ushort)mowns_vertex_3 << 0xf) >> 0xf) * auVar2[2]);
  this->owns_edge_1 = (bool)(mowns_edge_1 * auVar2[3]);
  this->owns_edge_2 = mowns_edge_2;
  this->owns_edge_3 = mowns_edge_3;
  this->sphereswept_rad = msphereswept_rad;
  (this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.m_shapeType =
       0x17;
  return;
}

Assistant:

cbtCEtriangleShape::cbtCEtriangleShape(ChVector<>* mp1,
                    ChVector<>* mp2,
                    ChVector<>* mp3,
                    ChVector<>* me1,
                    ChVector<>* me2,
                    ChVector<>* me3,
	                bool mowns_vertex_1,
                    bool mowns_vertex_2,
                    bool mowns_vertex_3,
                    bool mowns_edge_1,
                    bool mowns_edge_2,
                    bool mowns_edge_3,
                    double msphereswept_rad)
{
    p1 = mp1;
    p2 = mp2;
    p3 = mp3;
    e1 = me1;
    e2 = me2;
    e3 = me3;
    owns_vertex_1 = mowns_vertex_1;
    owns_vertex_2 = mowns_vertex_2;
    owns_vertex_3 = mowns_vertex_3;
    owns_edge_1 = mowns_edge_1;
    owns_edge_2 = mowns_edge_2;
    owns_edge_3 = mowns_edge_3;
    sphereswept_rad = msphereswept_rad;

    m_shapeType = CE_TRIANGLE_SHAPE_PROXYTYPE;
}